

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.hpp
# Opt level: O2

void __thiscall Optimizer::optimize(Optimizer *this,ScheduleHandle *origin,string *output_path)

{
  _Alloc_hider _Var1;
  Optimizer *pOVar2;
  string *path;
  pointer psVar3;
  bool bVar4;
  size_type sVar5;
  long lVar6;
  uint uVar7;
  shared_ptr<Schedule> *substitution;
  __shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2> *s2;
  char *pcVar8;
  pair<unsigned_long,_unsigned_long> pVar9;
  ScheduleHandle best;
  value_type top;
  vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> substitutions;
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  queue;
  Comparator comparator;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> hash_set;
  string local_128;
  __shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2> local_f8;
  long local_e8;
  Optimizer *local_e0;
  string *local_d8;
  vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> local_d0;
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  local_b8;
  Comparator local_90;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_80;
  string local_50;
  
  std::__shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_108,&origin->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>);
  pVar9 = Schedule::analyze((origin->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr);
  local_90.origin_time = pVar9.second;
  local_90.limit = this->limit;
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128._M_dataplus._M_p = (pointer)0x0;
  local_128._M_string_length = 0;
  local_128.field_2._M_allocated_capacity = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  ::priority_queue(&local_b8,&local_90,
                   (vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> *
                   )&local_128);
  std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::~vector
            ((vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> *)
             &local_128);
  std::
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  ::push(&local_b8,origin);
  local_128._M_dataplus._M_p =
       (pointer)Schedule::hash((origin->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::_M_insert_unique<unsigned_long>(&local_80,(unsigned_long *)&local_128);
  local_e0 = this;
  local_d8 = output_path;
  Schedule::info_abi_cxx11_
            (&local_128,(origin->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar7 = 0;
  printf(" > Start back-tracing search from source (%s)\n",local_128._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_128);
  local_e8 = std::chrono::_V2::system_clock::now();
  do {
    if (local_b8.c.
        super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_b8.c.
        super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) break;
    std::__shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_f8,
               &(local_b8.c.
                 super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>);
    std::
    priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
    ::pop(&local_b8);
    bVar4 = Comparator::considerable
                      (&local_90,(ScheduleHandle *)&local_108,(ScheduleHandle *)&local_f8);
    if (bVar4) {
      generateSubstitutions(&local_d0,(ScheduleHandle *)&local_f8);
      psVar3 = local_d0.
               super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar7 = uVar7 + 1;
      for (s2 = &(local_d0.
                  super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>;
          s2 != &psVar3->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>; s2 = s2 + 1) {
        local_128._M_dataplus._M_p = (pointer)Schedule::hash(s2->_M_ptr);
        sVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&local_80,(key_type_conflict *)&local_128);
        if (sVar5 == 0) {
          bVar4 = Comparator::considerable
                            (&local_90,(ScheduleHandle *)&local_108,(ScheduleHandle *)s2);
          if (bVar4) {
            std::
            priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
            ::push(&local_b8,(value_type *)s2);
            local_128._M_dataplus._M_p = (pointer)Schedule::hash(s2->_M_ptr);
            std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::_M_insert_unique<unsigned_long>(&local_80,(unsigned_long *)&local_128);
          }
          bVar4 = Comparator::operator()
                            (&local_90,(ScheduleHandle *)&local_108,(ScheduleHandle *)s2);
          if (bVar4) {
            std::__shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_108,s2);
          }
        }
      }
      bVar4 = Comparator::satisfy(&local_90,(ScheduleHandle *)&local_108);
      if (bVar4) {
        pcVar8 = " > Already satisfy requirement, stop searching";
LAB_0012712b:
        puts(pcVar8);
        bVar4 = true;
      }
      else {
        if (uVar7 == 0x5dc) {
          pcVar8 = " > Reach search limit, stop searching";
          goto LAB_0012712b;
        }
        if ((int)uVar7 % 300 == 0) {
          prettyBytes_abi_cxx11_(&local_128,(local_f8._M_ptr)->peak_memory);
          _Var1._M_p = local_128._M_dataplus._M_p;
          prettyNanoseconds_abi_cxx11_(&local_50,(local_f8._M_ptr)->total_time);
          bVar4 = false;
          printf(" > Progress (%d): %s, %s\n",(ulong)uVar7,_Var1._M_p,local_50._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_128);
        }
        else {
          bVar4 = false;
        }
      }
      std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::~vector
                (&local_d0);
    }
    else {
      bVar4 = false;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
  } while (!bVar4);
  puts(" > Result:");
  printf("   > Schedules searched: %d\n",(ulong)uVar7);
  lVar6 = std::chrono::_V2::system_clock::now();
  prettyNanoseconds_abi_cxx11_(&local_128,lVar6 - local_e8);
  printf("   > Time used: %s\n",local_128._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_128);
  Schedule::info_abi_cxx11_(&local_128,local_108._M_ptr);
  path = local_d8;
  pOVar2 = local_e0;
  printf("   > Best: {%s}\n",local_128._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_128);
  pcVar8 = "true";
  if (pOVar2->limit < (local_108._M_ptr)->peak_memory) {
    pcVar8 = "false";
  }
  printf("   > Satisfy memory: %s\n",pcVar8);
  printf(" > Writing result into path %s ... ",(path->_M_dataplus)._M_p);
  Schedule::restoreAndDumpToFile(local_108._M_ptr,path);
  puts("OK!");
  std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::~vector
            (&local_b8.c);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
  return;
}

Assistant:

void optimize(const ScheduleHandle &origin, const std::string &output_path) const {
        ScheduleHandle best = origin;
        auto comparator = Comparator{origin->analyze().second, limit};
        std::set<size_t> hash_set;
        std::priority_queue<ScheduleHandle, std::vector<ScheduleHandle>, Comparator> queue(comparator);

        // Source
        queue.push(origin);
        hash_set.insert(origin->hash());

        // Back-tracing search
        printf(" > Start back-tracing search from source (%s)\n", origin->info().c_str());
        Timer timer;
        int count = 0;
        while (not queue.empty()) {
            auto top = queue.top();
            queue.pop();

            if (not comparator.considerable(best, top)) {
                continue;
            }

            ++ count;

            // Substitute
            std::vector<ScheduleHandle> substitutions = generateSubstitutions(top);

            // Insert and check
            for (auto &substitution: substitutions) {
                if (hash_set.count(substitution->hash())) {
                    continue;
                }
                if (comparator.considerable(best, substitution)) {
                    queue.push(substitution);
                    hash_set.insert(substitution->hash());
                }
                if (comparator(best, substitution)) {
                    best = substitution;
                }
            }

            if (comparator.satisfy(best)) {
                printf(" > Already satisfy requirement, stop searching\n");
                break;
            }

            if (count == SEARCH_LIMIT) {
                printf(" > Reach search limit, stop searching\n");
                break;
            }

            if (count % PRINT_FREQUENCY == 0) {
                printf(" > Progress (%d): %s, %s\n", count, prettyBytes(top->peak_memory).c_str(), prettyNanoseconds(top->total_time).c_str());
            }
        }

        // Show best
        printf(" > Result:\n");
        printf("   > Schedules searched: %d\n", count);
        printf("   > Time used: %s\n", prettyNanoseconds(timer.tik()).c_str());
        printf("   > Best: {%s}\n", best->info().c_str());
        printf("   > Satisfy memory: %s\n", best->peak_memory <= limit ? "true" : "false");

        // Write result
        printf(" > Writing result into path %s ... ", output_path.c_str());
        best->restoreAndDumpToFile(output_path);
        printf("OK!\n");
    }